

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

timeval tvnow(void)

{
  timeval tVar1;
  int iVar2;
  undefined1 local_28 [8];
  timespec tsnow;
  timeval now;
  
  iVar2 = clock_gettime(1,(timespec *)local_28);
  if (iVar2 == 0) {
    tsnow.tv_nsec = (__syscall_slong_t)local_28;
    now.tv_sec = tsnow.tv_sec / 1000;
  }
  else {
    gettimeofday((timeval *)&tsnow.tv_nsec,(__timezone_ptr_t)0x0);
  }
  tVar1.tv_usec = now.tv_sec;
  tVar1.tv_sec = tsnow.tv_nsec;
  return tVar1;
}

Assistant:

static struct timeval tvnow(void)
{
  /*
  ** clock_gettime() is granted to be increased monotonically when the
  ** monotonic clock is queried. Time starting point is unspecified, it
  ** could be the system start-up time, the Epoch, or something else,
  ** in any case the time starting point does not change once that the
  ** system has started up.
  */
  struct timeval now;
  struct timespec tsnow;
  if(0 == clock_gettime(CLOCK_MONOTONIC, &tsnow)) {
    now.tv_sec = tsnow.tv_sec;
    now.tv_usec = tsnow.tv_nsec / 1000;
  }
  /*
  ** Even when the configure process has truly detected monotonic clock
  ** availability, it might happen that it is not actually available at
  ** run-time. When this occurs simply fallback to other time source.
  */
#ifdef HAVE_GETTIMEOFDAY
  else
    (void)gettimeofday(&now, NULL);
#else
  else {
    now.tv_sec = (long)time(NULL);
    now.tv_usec = 0;
  }
#endif
  return now;
}